

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O2

deUint32 __thiscall tcu::astc::anon_unknown_0::Block128::getBits(Block128 *this,int low,int high)

{
  byte bVar1;
  deUint32 dVar2;
  
  if (high - low == -1) {
    dVar2 = 0;
  }
  else {
    bVar1 = (byte)((long)high % 0x40);
    if (low / 0x40 == high / 0x40) {
      dVar2 = (deUint32)
              ((this->m_words[low / 0x40] & (2L << ((byte)((long)high % 0x40) & 0x3f)) - 1U) >>
              ((byte)low & 0x3f));
    }
    else {
      dVar2 = (uint)(this->m_words[low / 0x40] >> ((byte)((long)low % 0x40) & 0x3f)) |
              (uint)(((2L << (bVar1 & 0x3f)) + 0xffffffffU & this->m_words[high / 0x40]) <<
                    ((char)(high - low) - bVar1 & 0x3f));
    }
  }
  return dVar2;
}

Assistant:

deUint32 getBits (int low, int high) const
	{
		DE_ASSERT(de::inBounds(low, 0, 128));
		DE_ASSERT(de::inBounds(high, 0, 128));
		DE_ASSERT(de::inRange(high-low+1, 0, 32));

		if (high-low+1 == 0)
			return 0;

		const int word0Ndx = low / WORD_BITS;
		const int word1Ndx = high / WORD_BITS;

		// \note "foo << bar << 1" done instead of "foo << (bar+1)" to avoid overflow, i.e. shift amount being too big.

		if (word0Ndx == word1Ndx)
			return (deUint32)((m_words[word0Ndx] & ((((Word)1 << high%WORD_BITS << 1) - 1))) >> ((Word)low % WORD_BITS));
		else
		{
			DE_ASSERT(word1Ndx == word0Ndx + 1);

			return (deUint32)(m_words[word0Ndx] >> (low%WORD_BITS)) |
				   (deUint32)((m_words[word1Ndx] & (((Word)1 << high%WORD_BITS << 1) - 1)) << (high-low - high%WORD_BITS));
		}
	}